

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O0

utf8iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
utf8iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator++(utf8iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this)

{
  byte *pbVar1;
  uint local_2c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_28;
  int n;
  byte local_19;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_18;
  uint8_t b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  utf8iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  _Stack_18._M_current = (this->_ptr)._M_current;
  p._M_current = (char *)this;
  _Stack_28 = __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++(&stack0xffffffffffffffe8,0);
  pbVar1 = (byte *)__gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&stack0xffffffffffffffd8);
  local_19 = *pbVar1;
  if (local_19 < 0xf0) {
    if (local_19 < 0xe0) {
      local_2c = (uint)(0xbf < local_19);
    }
    else {
      local_2c = 2;
    }
  }
  else {
    local_2c = 3;
  }
  while (local_2c != 0) {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&stack0xffffffffffffffe8,0);
    local_2c = local_2c - 1;
  }
  (this->_ptr)._M_current = _Stack_18._M_current;
  return this;
}

Assistant:

utf8iterator& operator++()
    {
        P p=_ptr;
        uint8_t b0= *p++;
        int n;
        if (b0>=0xf0) {
            n=3;
        }
        else if (b0>=0xe0) {
            n=2;
        }
        else if (b0>=0xc0) {
            n=1;
        }
        else {
            n=0;
        }
        while (n--) {
            p++;
        }
        _ptr= p;
        return *this;
    }